

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_8ca613::HandleExportAndroidMKMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  undefined8 uVar1;
  bool bVar2;
  uint uVar3;
  const_reference pvVar4;
  reference args_00;
  ulong uVar5;
  long lVar6;
  cmGlobalGenerator *this;
  cmExportSetMap *this_00;
  string *__args_2;
  string *__args_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_4;
  string *__args_5;
  static_string_view sVar7;
  bool local_6a9;
  undefined1 local_638 [23];
  undefined1 local_621;
  undefined1 local_620 [16];
  unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_> local_610;
  bool local_604 [4];
  cmExportSet *pcStack_600;
  MessageLevel message;
  cmExportSet *exportSet;
  cmAlphaNum local_5c8;
  string local_598;
  cmAlphaNum local_578;
  cmAlphaNum local_548;
  string local_518;
  byte local_4f1;
  string local_4f0;
  cmAlphaNum local_4d0;
  cmAlphaNum local_4a0;
  string local_470;
  undefined1 local_450 [8];
  string fname;
  cmAlphaNum local_400;
  string local_3d0;
  undefined4 local_3ac;
  cmAlphaNum local_3a8;
  cmAlphaNum local_378;
  string local_348;
  ParseResult local_328;
  undefined1 local_2f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  undefined1 local_2a0 [8];
  string filename;
  undefined1 local_278 [7];
  bool exportOld;
  string name_space;
  string exp;
  string local_228;
  undefined1 local_208 [8];
  cmInstallCommandArguments ica;
  Helper helper;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  helper.DefaultComponentName.field_2._8_8_ = status;
  Helper::Helper((Helper *)((long)&ica.DefaultComponentName.field_2 + 8),status);
  std::__cxx11::string::string((string *)&local_228,(string *)&helper.Makefile);
  cmInstallCommandArguments::cmInstallCommandArguments
            ((cmInstallCommandArguments *)local_208,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::string((string *)(name_space.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_278);
  filename.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)local_2a0);
  sVar7 = ::cm::operator____s("EXPORT_ANDROID_MK",0x11);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            ((cmArgumentParser<void> *)local_208,sVar7,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&name_space.field_2 + 8));
  sVar7 = ::cm::operator____s("NAMESPACE",9);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            ((cmArgumentParser<void> *)local_208,sVar7,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278);
  sVar7 = ::cm::operator____s("EXPORT_LINK_INTERFACE_LIBRARIES",0x1f);
  cmArgumentParser<void>::Bind<bool>
            ((cmArgumentParser<void> *)local_208,sVar7,(bool *)(filename.field_2._M_local_buf + 0xf)
            );
  sVar7 = ::cm::operator____s("FILE",4);
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)sVar7.super_string_view._M_len;
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            ((cmArgumentParser<void> *)local_208,sVar7,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_2f8);
  cmArgumentParser<void>::
  Parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_328,(cmArgumentParser<void> *)local_208,args,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2f8,0);
  ArgumentParser::ParseResult::~ParseResult(&local_328);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2f8);
  uVar1 = helper.DefaultComponentName.field_2._8_8_;
  if (bVar2) {
    bVar2 = cmInstallCommandArguments::Finalize((cmInstallCommandArguments *)local_208);
    if (bVar2) {
      cmInstallCommandArguments::GetDestination_abi_cxx11_((cmInstallCommandArguments *)local_208);
      uVar5 = std::__cxx11::string::empty();
      uVar1 = helper.DefaultComponentName.field_2._8_8_;
      if ((uVar5 & 1) == 0) {
        std::__cxx11::string::string((string *)local_450,(string *)local_2a0);
        lVar6 = std::__cxx11::string::find_first_of(local_450,0xc70f03);
        uVar1 = helper.DefaultComponentName.field_2._8_8_;
        if (lVar6 == -1) {
          uVar3 = std::__cxx11::string::empty();
          local_4f1 = 0;
          local_6a9 = false;
          if ((uVar3 & 1) == 0) {
            cmsys::SystemTools::GetFilenameLastExtension(&local_4f0,(string *)local_450);
            local_4f1 = 1;
            local_6a9 = std::operator!=(&local_4f0,".mk");
          }
          if ((local_4f1 & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_4f0);
          }
          uVar1 = helper.DefaultComponentName.field_2._8_8_;
          if (local_6a9 == false) {
            lVar6 = std::__cxx11::string::find_first_of(local_450,0xc70f03);
            uVar1 = helper.DefaultComponentName.field_2._8_8_;
            if (lVar6 == -1) {
              uVar5 = std::__cxx11::string::empty();
              if ((uVar5 & 1) != 0) {
                std::__cxx11::string::operator=((string *)local_450,"Android.mk");
              }
              this = cmMakefile::GetGlobalGenerator((cmMakefile *)helper.Status);
              this_00 = cmGlobalGenerator::GetExportSets(this);
              pcStack_600 = cmExportSetMap::operator[]
                                      (this_00,(string *)((long)&name_space.field_2 + 8));
              local_604 = (bool  [4])
                          cmInstallGenerator::SelectMessageLevel((cmMakefile *)helper.Status,false);
              local_620._0_8_ = pcStack_600;
              __args_2 = cmInstallCommandArguments::GetDestination_abi_cxx11_
                                   ((cmInstallCommandArguments *)local_208);
              __args_3 = cmInstallCommandArguments::GetPermissions_abi_cxx11_
                                   ((cmInstallCommandArguments *)local_208);
              __args_4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         cmInstallCommandArguments::GetConfigurations_abi_cxx11_
                                   ((cmInstallCommandArguments *)local_208);
              __args_5 = cmInstallCommandArguments::GetComponent_abi_cxx11_
                                   ((cmInstallCommandArguments *)local_208);
              local_621 = (_Alloc_hider)
                          cmInstallCommandArguments::GetExcludeFromAll
                                    ((cmInstallCommandArguments *)local_208);
              local_638[0x16] = 1;
              cmMakefile::GetBacktrace((cmMakefile *)local_638);
              std::
              make_unique<cmInstallExportGenerator,cmExportSet*,std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&,cmInstallGenerator::MessageLevel&,bool,std::__cxx11::string&,std::__cxx11::string&,char_const(&)[1],bool&,bool,cmListFileBacktrace>
                        ((cmExportSet **)(local_620 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_620,__args_2,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)__args_3,__args_4,(MessageLevel *)__args_5,local_604,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_621,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_450,(char (*) [1])local_278,(bool *)0xcbf1b7,
                         (bool *)(filename.field_2._M_local_buf + 0xf),
                         (cmListFileBacktrace *)(local_638 + 0x16));
              std::unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>>::
              unique_ptr<cmInstallExportGenerator,std::default_delete<cmInstallExportGenerator>,void>
                        ((unique_ptr<cmInstallGenerator,std::default_delete<cmInstallGenerator>> *)
                         &local_610,
                         (unique_ptr<cmInstallExportGenerator,_std::default_delete<cmInstallExportGenerator>_>
                          *)(local_620 + 8));
              cmMakefile::AddInstallGenerator((cmMakefile *)helper.Status,&local_610);
              std::unique_ptr<cmInstallGenerator,_std::default_delete<cmInstallGenerator>_>::
              ~unique_ptr(&local_610);
              std::
              unique_ptr<cmInstallExportGenerator,_std::default_delete<cmInstallExportGenerator>_>::
              ~unique_ptr((unique_ptr<cmInstallExportGenerator,_std::default_delete<cmInstallExportGenerator>_>
                           *)(local_620 + 8));
              cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_638);
              args_local._7_1_ = true;
            }
            else {
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](args,0);
              cmAlphaNum::cmAlphaNum(&local_5c8,pvVar4);
              cmAlphaNum::cmAlphaNum((cmAlphaNum *)&exportSet," given export name \"");
              cmStrCat<std::__cxx11::string,char[144]>
                        (&local_598,&local_5c8,(cmAlphaNum *)&exportSet,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&name_space.field_2 + 8),
                         (char (*) [144])
                         "\".  This name cannot be safely converted to a file name.  Specify a different export name or use the FILE option to set a file name explicitly."
                        );
              cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_598);
              std::__cxx11::string::~string((string *)&local_598);
              args_local._7_1_ = false;
            }
          }
          else {
            pvVar4 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::operator[](args,0);
            cmAlphaNum::cmAlphaNum(&local_548,pvVar4);
            cmAlphaNum::cmAlphaNum(&local_578," given invalid export file name \"");
            cmStrCat<std::__cxx11::string,char[59]>
                      (&local_518,&local_548,&local_578,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_450,
                       (char (*) [59])
                       "\".  The FILE argument must specify a name ending in \".mk\".");
            cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_518);
            std::__cxx11::string::~string((string *)&local_518);
            args_local._7_1_ = false;
          }
        }
        else {
          pvVar4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](args,0);
          cmAlphaNum::cmAlphaNum(&local_4a0,pvVar4);
          cmAlphaNum::cmAlphaNum(&local_4d0," given invalid export file name \"");
          cmStrCat<std::__cxx11::string,char[93]>
                    (&local_470,&local_4a0,&local_4d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_450,
                     (char (*) [93])
                     "\".  The FILE argument may not contain a path.  Specify the path in the DESTINATION argument."
                    );
          cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_470);
          std::__cxx11::string::~string((string *)&local_470);
          args_local._7_1_ = false;
        }
        local_3ac = 1;
        std::__cxx11::string::~string((string *)local_450);
      }
      else {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](args,0);
        cmAlphaNum::cmAlphaNum(&local_400,pvVar4);
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&fname.field_2 + 8)," given no DESTINATION!");
        cmStrCat<>(&local_3d0,&local_400,(cmAlphaNum *)((long)&fname.field_2 + 8));
        cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_3d0);
        std::__cxx11::string::~string((string *)&local_3d0);
        args_local._7_1_ = false;
        local_3ac = 1;
      }
    }
    else {
      args_local._7_1_ = false;
      local_3ac = 1;
    }
  }
  else {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](args,0);
    cmAlphaNum::cmAlphaNum(&local_378,pvVar4);
    cmAlphaNum::cmAlphaNum(&local_3a8," given unknown argument \"");
    args_00 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2f8,0);
    cmStrCat<std::__cxx11::string,char[3]>
              (&local_348,&local_378,&local_3a8,args_00,(char (*) [3])0xc51f8d);
    cmExecutionStatus::SetError((cmExecutionStatus *)uVar1,&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    args_local._7_1_ = false;
    local_3ac = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2f8);
  std::__cxx11::string::~string((string *)local_2a0);
  std::__cxx11::string::~string((string *)local_278);
  std::__cxx11::string::~string((string *)(name_space.field_2._M_local_buf + 8));
  cmInstallCommandArguments::~cmInstallCommandArguments((cmInstallCommandArguments *)local_208);
  Helper::~Helper((Helper *)((long)&ica.DefaultComponentName.field_2 + 8));
  return args_local._7_1_;
}

Assistant:

bool HandleExportAndroidMKMode(std::vector<std::string> const& args,
                               cmExecutionStatus& status)
{
#ifndef CMAKE_BOOTSTRAP
  Helper helper(status);

  // This is the EXPORT mode.
  cmInstallCommandArguments ica(helper.DefaultComponentName);

  std::string exp;
  std::string name_space;
  bool exportOld = false;
  std::string filename;

  ica.Bind("EXPORT_ANDROID_MK"_s, exp);
  ica.Bind("NAMESPACE"_s, name_space);
  ica.Bind("EXPORT_LINK_INTERFACE_LIBRARIES"_s, exportOld);
  ica.Bind("FILE"_s, filename);

  std::vector<std::string> unknownArgs;
  ica.Parse(args, &unknownArgs);

  if (!unknownArgs.empty()) {
    // Unknown argument.
    status.SetError(
      cmStrCat(args[0], " given unknown argument \"", unknownArgs[0], "\"."));
    return false;
  }

  if (!ica.Finalize()) {
    return false;
  }

  // Make sure there is a destination.
  if (ica.GetDestination().empty()) {
    // A destination is required.
    status.SetError(cmStrCat(args[0], " given no DESTINATION!"));
    return false;
  }

  // Check the file name.
  std::string fname = filename;
  if (fname.find_first_of(":/\\") != std::string::npos) {
    status.SetError(cmStrCat(args[0], " given invalid export file name \"",
                             fname,
                             "\".  The FILE argument may not contain a path.  "
                             "Specify the path in the DESTINATION argument."));
    return false;
  }

  // Check the file extension.
  if (!fname.empty() &&
      cmSystemTools::GetFilenameLastExtension(fname) != ".mk") {
    status.SetError(cmStrCat(
      args[0], " given invalid export file name \"", fname,
      R"(".  The FILE argument must specify a name ending in ".mk".)"));
    return false;
  }
  if (fname.find_first_of(":/\\") != std::string::npos) {
    status.SetError(
      cmStrCat(args[0], " given export name \"", exp,
               "\".  "
               "This name cannot be safely converted to a file name.  "
               "Specify a different export name or use the FILE option to set "
               "a file name explicitly."));
    return false;
  }
  // Use the default name
  if (fname.empty()) {
    fname = "Android.mk";
  }

  cmExportSet& exportSet =
    helper.Makefile->GetGlobalGenerator()->GetExportSets()[exp];

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(helper.Makefile);

  // Create the export install generator.
  helper.Makefile->AddInstallGenerator(
    cm::make_unique<cmInstallExportGenerator>(
      &exportSet, ica.GetDestination(), ica.GetPermissions(),
      ica.GetConfigurations(), ica.GetComponent(), message,
      ica.GetExcludeFromAll(), fname, name_space, "", exportOld, true,
      helper.Makefile->GetBacktrace()));

  return true;
#else
  static_cast<void>(args);
  status.SetError("EXPORT_ANDROID_MK not supported in bootstrap cmake");
  return false;
#endif
}